

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Node * prvTidyParseNamespace(TidyDocImpl *doc,Node *basenode,GetTokenMode mode)

{
  uint uVar1;
  Lexer *pLVar2;
  Node *pNVar3;
  bool bVar4;
  TidyTagId TVar5;
  Node *pNVar6;
  AttVal *pAVar7;
  Node **ppNVar8;
  Node *node;
  Node *pNVar9;
  bool bVar10;
  Node *local_58;
  undefined8 uStack_50;
  ulong local_48;
  Node *pNStack_40;
  Node *local_38;
  
  pLVar2 = doc->lexer;
  prvTidyDeferDup(doc);
  uVar1 = pLVar2->istackbase;
  pLVar2->istackbase = pLVar2->istacksize;
  pNVar6 = prvTidyGetToken(doc,OtherNamespace);
  node = basenode;
  do {
    if (pNVar6 == (Node *)0x0) {
      prvTidyReport(doc,basenode->parent,basenode,0x25a);
      return (Node *)0x0;
    }
    if (pNVar6->type == StartTag) {
      for (pAVar7 = pNVar6->attributes; pAVar7 != (AttVal *)0x0; pAVar7 = pAVar7->next) {
        pAVar7->dict = (Attribute *)0x0;
      }
      pNVar6->parent = node;
      pNVar9 = pNVar6;
      if (node == (Node *)0x0) {
        pNVar6->prev = (Node *)0x0;
LAB_0013cb2b:
        if (node == (Node *)0x0) goto LAB_0013cbbc;
        ppNVar8 = &node->content;
      }
      else {
        pNVar3 = node->last;
        pNVar6->prev = pNVar3;
        if (pNVar3 == (Node *)0x0) goto LAB_0013cb2b;
        ppNVar8 = &pNVar3->next;
      }
      *ppNVar8 = pNVar6;
joined_r0x0013cb41:
      if (node != (Node *)0x0) {
        node->last = pNVar6;
      }
    }
    else {
      if (pNVar6->type != EndTag) {
        for (pAVar7 = pNVar6->attributes; pAVar7 != (AttVal *)0x0; pAVar7 = pAVar7->next) {
          pAVar7->dict = (Attribute *)0x0;
        }
        pNVar6->parent = node;
        pNVar9 = node;
        if (node == (Node *)0x0) {
          pNVar6->prev = (Node *)0x0;
LAB_0013cb4d:
          if (node == (Node *)0x0) goto LAB_0013cbbc;
          ppNVar8 = &node->content;
        }
        else {
          pNVar3 = node->last;
          pNVar6->prev = pNVar3;
          if (pNVar3 == (Node *)0x0) goto LAB_0013cb4d;
          ppNVar8 = &pNVar3->next;
        }
        *ppNVar8 = pNVar6;
        goto joined_r0x0013cb41;
      }
      local_58 = (Node *)0x0;
      uStack_50 = 0;
      if (pNVar6->tag == (Dict *)0x0) {
        TVar5 = TidyTag_UNKNOWN;
      }
      else {
        TVar5 = pNVar6->tag->id;
      }
      local_48 = (ulong)TVar5;
      pNStack_40 = pNVar6;
      local_38 = basenode;
      prvTidyTraverseNodeTree((TidyDocImpl *)0x0,node,FindDescendant_cb,&local_58);
      pNVar9 = local_58;
      if (local_58 == (Node *)0x0) {
        prvTidyReport(doc,node,pNVar6,0x235);
        if (node == (Node *)0x0) {
          __assert_fail("parent",
                        "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/parser.c"
                        ,0x1018,"Node *prvTidyParseNamespace(TidyDocImpl *, Node *, GetTokenMode)");
        }
        prvTidyFreeNode(doc,pNVar6);
        bVar4 = true;
      }
      else {
        for (; node != (Node *)0x0; node = node->parent) {
          if ((node == pNVar9) || (node == basenode->parent)) {
            if (node != (Node *)0x0) {
              node->closed = yes;
              prvTidyFreeNode(doc,pNVar6);
              pNVar6 = node->parent;
              goto LAB_0013cb99;
            }
            break;
          }
          node->closed = yes;
          prvTidyReport(doc,node->parent,node,0x259);
        }
        prvTidyFreeNode(doc,pNVar6);
        pNVar6 = (Node *)0x0;
LAB_0013cb99:
        bVar4 = true;
        bVar10 = node == basenode;
        node = pNVar6;
        if (bVar10) {
          pLVar2->istackbase = uVar1;
          if ((basenode == (Node *)0x0) || (basenode->closed != yes)) {
            __assert_fail("basenode && basenode->closed == yes",
                          "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/parser.c"
                          ,0x100f,"Node *prvTidyParseNamespace(TidyDocImpl *, Node *, GetTokenMode)"
                         );
          }
          bVar4 = false;
        }
      }
      pNVar9 = node;
      if (!bVar4) {
        return (Node *)0x0;
      }
    }
LAB_0013cbbc:
    pNVar6 = prvTidyGetToken(doc,OtherNamespace);
    node = pNVar9;
  } while( true );
}

Assistant:

Node* TY_(ParseNamespace)( TidyDocImpl* doc, Node *basenode, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;
    Node *node;
    Node *parent = basenode;
    uint istackbase;
    AttVal* av; /* #130 MathML attr and entity fix! */

    /* a la <table>: defer popping elements off the inline stack */
    TY_(DeferDup)( doc );
    istackbase = lexer->istackbase;
    lexer->istackbase = lexer->istacksize;

    mode = OtherNamespace; /* Preformatted; IgnoreWhitespace; */

    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        /*
        fix check to skip action in InsertMisc for regular/empty
        nodes, which we don't want here...

        The way we do it here is by checking and processing everything
        and only what remains goes into InsertMisc()
        */

        /* is this a close tag? And does it match the current parent node? */
        if (node->type == EndTag)
        {
            /*
            to prevent end tags flowing from one 'alternate namespace' we
            check this in two phases: first we check if the tag is a
            descendant of the current node, and when it is, we check whether
            it is the end tag for a node /within/ or /outside/ the basenode.
            */
            Bool outside;
            Node *mp = FindMatchingDescendant(parent, node, basenode, &outside);

            if (mp != NULL)
            {
                /*
                when mp != parent as we might expect,
                infer end tags until we 'hit' the matched
                parent or the basenode
                */
                Node *n;

                for (n = parent;
                     n != NULL && n != basenode->parent && n != mp;
                     n = n->parent)
                {
                    /* n->implicit = yes; */
                    n->closed = yes;
                    TY_(Report)(doc, n->parent, n, MISSING_ENDTAG_BEFORE);
                }

                /* Issue #369 - Since 'assert' is DEBUG only, and there are
                   simple cases where these can be fired, removing them
                   pending feedback from the original author!
                   assert(outside == no ? n == mp : 1);
                   assert(outside == yes ? n == basenode->parent : 1);
                   =================================================== */

                if (outside == no)
                {
                    /* EndTag for a node within the basenode subtree. Roll on... */
                    if (n)
                        n->closed = yes;
                    TY_(FreeNode)(doc, node);

                    node = n;
                    parent = node ? node->parent : NULL;
                }
                else
                {
                    /* EndTag for a node outside the basenode subtree: let the caller handle that. */
                    TY_(UngetToken)( doc );
                    node = basenode;
                    parent = node->parent;
                }

                /* when we've arrived at the end-node for the base node, it's quitting time */
                if (node == basenode)
                {
                    lexer->istackbase = istackbase;
                    assert(basenode && basenode->closed == yes);
                    return NULL;
                }
            }
            else
            {
                /* unmatched close tag: report an error and discard */
                /* TY_(Report)(doc, parent, node, NON_MATCHING_ENDTAG); Issue #308 - Seems wrong warning! */
                TY_(Report)(doc, parent, node, DISCARDING_UNEXPECTED);
                assert(parent);
                /* assert(parent->tag != node->tag); Issue #308 - Seems would always be true! */
                TY_(FreeNode)( doc, node); /* Issue #308 - Discard unexpected end tag memory */
            }
        }
        else if (node->type == StartTag)
        {
            /* #130 MathML attr and entity fix!
               care if it has attributes, and 'accidently' any of those attributes match known */
            for ( av = node->attributes; av; av = av->next )
            {
                av->dict = 0; /* does something need to be freed? */
            }
            /* add another child to the current parent */
            TY_(InsertNodeAtEnd)(parent, node);
            parent = node;
        }
        else
        {
            /* #130 MathML attr and entity fix!
               care if it has attributes, and 'accidently' any of those attributes match known */
            for ( av = node->attributes; av; av = av->next )
            {
                av->dict = 0; /* does something need to be freed? */
            }
            TY_(InsertNodeAtEnd)(parent, node);
        }
    }

    TY_(Report)(doc, basenode->parent, basenode, MISSING_ENDTAG_FOR);
    return NULL;
}